

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::setClipboardSelection(QWidgetTextControlPrivate *this)

{
  char cVar1;
  Mode MVar2;
  QMimeData *pQVar3;
  
  pQVar3 = (QMimeData *)QGuiApplication::clipboard();
  cVar1 = QTextCursor::hasSelection();
  if (cVar1 != '\0') {
    cVar1 = QClipboard::supportsSelection();
    if (cVar1 != '\0') {
      MVar2 = (**(code **)(**(long **)&this->field_0x8 + 0x98))();
      QClipboard::setMimeData(pQVar3,MVar2);
      return;
    }
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::setClipboardSelection()
{
    QClipboard *clipboard = QGuiApplication::clipboard();
    if (!cursor.hasSelection() || !clipboard->supportsSelection())
        return;
    Q_Q(QWidgetTextControl);
    QMimeData *data = q->createMimeDataFromSelection();
    clipboard->setMimeData(data, QClipboard::Selection);
}